

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O1

void __thiscall KDIS::KDataStream::Write<unsigned_long_long>(KDataStream *this,unsigned_long_long T)

{
  long lVar1;
  unsigned_long_long *puVar2;
  KUINT8 i;
  KOCTET Temp [8];
  NetToDataType<unsigned_long_long> OctArray;
  undefined8 uStack_30;
  unsigned_long_long local_28;
  unsigned_long_long local_20;
  
  local_20 = T;
  if (this->m_MachineEndian != this->m_NetEndian) {
    local_28 = T;
    lVar1 = 8;
    puVar2 = &local_20;
    do {
      *(undefined1 *)puVar2 = *(undefined1 *)((long)&uStack_30 + lVar1 + 7);
      puVar2 = (unsigned_long_long *)((long)puVar2 + 1);
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  lVar1 = 0;
  do {
    local_28 = CONCAT71(local_28._1_7_,*(undefined1 *)((long)&local_20 + lVar1));
    uStack_30 = 0x2802c9;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,(uchar *)&local_28);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}